

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureStateQueryTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::getVerifierSuffix(QueryType type)

{
  char *pcStack_10;
  QueryType type_local;
  
  switch(type) {
  case QUERY_TEXTURE_PARAM_INTEGER:
  case QUERY_TEXTURE_PARAM_INTEGER_VEC4:
    pcStack_10 = "_integer";
    break;
  case QUERY_TEXTURE_PARAM_FLOAT:
  case QUERY_TEXTURE_PARAM_FLOAT_VEC4:
    pcStack_10 = "_float";
    break;
  case QUERY_TEXTURE_PARAM_PURE_INTEGER:
  case QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4:
    pcStack_10 = "_pure_int";
    break;
  case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER:
  case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4:
    pcStack_10 = "_pure_uint";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getVerifierSuffix (QueryType type)
{
	switch (type)
	{
		case QUERY_TEXTURE_PARAM_FLOAT:
		case QUERY_TEXTURE_PARAM_FLOAT_VEC4:					return "_float";

		case QUERY_TEXTURE_PARAM_INTEGER:
		case QUERY_TEXTURE_PARAM_INTEGER_VEC4:					return "_integer";

		case QUERY_TEXTURE_PARAM_PURE_INTEGER:
		case QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4:				return "_pure_int";

		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER:
		case QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4:	return "_pure_uint";

		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}
}